

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O2

Complex * dto::unmarshall<dto::Complex>(Complex *__return_storage_ptr__,string *packet)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  Error *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->header).cmd_seq = 0;
  (__return_storage_ptr__->header).param = 0;
  (__return_storage_ptr__->header).cmd[0] = '\0';
  (__return_storage_ptr__->header).cmd[1] = '\0';
  (__return_storage_ptr__->header).cmd[2] = '\0';
  (__return_storage_ptr__->header).cmd[3] = '\0';
  (__return_storage_ptr__->header).cmd[4] = '\0';
  (__return_storage_ptr__->header).cmd[5] = '\0';
  (__return_storage_ptr__->header).cmd[6] = '\0';
  (__return_storage_ptr__->header).cmd[7] = '\0';
  *(undefined8 *)((__return_storage_ptr__->header).cmd + 8) = 0;
  (__return_storage_ptr__->payload)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->payload).field_2;
  (__return_storage_ptr__->payload)._M_string_length = 0;
  (__return_storage_ptr__->payload).field_2._M_local_buf[0] = '\0';
  uVar1 = packet->_M_string_length;
  if (0x19 < uVar1) {
    pcVar2 = (packet->_M_dataplus)._M_p;
    uVar4 = *(undefined8 *)pcVar2;
    uVar5 = *(undefined8 *)(pcVar2 + 8);
    uVar6 = *(uint64_t *)(pcVar2 + 0x12);
    (__return_storage_ptr__->header).cmd_seq = *(uint64_t *)(pcVar2 + 10);
    (__return_storage_ptr__->header).param = uVar6;
    *(undefined8 *)(__return_storage_ptr__->header).cmd = uVar4;
    *(undefined8 *)((__return_storage_ptr__->header).cmd + 8) = uVar5;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct((ulong)local_40,(char)uVar1 + -0x1a);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->payload,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    memcpy((__return_storage_ptr__->payload)._M_dataplus._M_p,(packet->_M_dataplus)._M_p + 0x1a,
           packet->_M_string_length - 0x1a);
    uVar1 = (__return_storage_ptr__->header).cmd_seq;
    uVar3 = (__return_storage_ptr__->header).param;
    (__return_storage_ptr__->header).cmd_seq =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    (__return_storage_ptr__->header).param =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    return __return_storage_ptr__;
  }
  this = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this,"Too small packet");
  __cxa_throw(this,&Error::typeinfo,std::exception::~exception);
}

Assistant:

inline T unmarshall(std::string &packet) {
  T dto;
  int hdr_size = sizeof(decltype(dto.header));
  if (packet.size() < hdr_size) {
    throw Error("Too small packet");
  }
  memcpy(&dto.header, &packet[0], hdr_size);
  dto.payload = std::string(packet.size() - hdr_size, '\0');
  memcpy(&dto.payload[0], &packet[hdr_size], packet.size() - hdr_size);
  do_ntoh(&dto.header);
  return dto;
}